

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type __thiscall
FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>
::dx(FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>
     *this,int i)

{
  double dVar1;
  Fad<double> *pFVar2;
  double *pdVar3;
  value_type vVar4;
  
  pFVar2 = (((this->left_->fadexpr_).left_)->fadexpr_).right_;
  pdVar3 = &pFVar2->defaultVal;
  if ((pFVar2->dx_).num_elts != 0) {
    pdVar3 = (pFVar2->dx_).ptr_to_data + i;
  }
  dVar1 = *pdVar3;
  vVar4 = FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>
          ::dx(&((this->left_->fadexpr_).right_)->fadexpr_,i);
  pFVar2 = (this->right_->fadexpr_).right_;
  pdVar3 = &pFVar2->defaultVal;
  if ((pFVar2->dx_).num_elts != 0) {
    pdVar3 = (pFVar2->dx_).ptr_to_data + i;
  }
  return vVar4 + dVar1 + (double)(this->right_->fadexpr_).left_.constant_ * *pdVar3;
}

Assistant:

const value_type dx(int i) const {return left_.dx(i) + right_.dx(i);}